

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

void __thiscall
qclab::dense::SquareMatrix<float>::SquareMatrix
          (SquareMatrix<float> *this,float m00,float m01,float m02,float m03,float m10,float m11,
          float m12,float m13,float m20,float m21,float m22,float m23,float m30,float m31,float m32,
          float m33)

{
  type pfVar1;
  float m13_local;
  float m12_local;
  float m11_local;
  float m10_local;
  float m03_local;
  float m02_local;
  float m01_local;
  float m00_local;
  SquareMatrix<float> *this_local;
  
  this->size_ = 4;
  alloc_unique_array<float>((dense *)&this->data_,0x10);
  pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&this->data_,0);
  *pfVar1 = m00;
  pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&this->data_,1);
  *pfVar1 = m10;
  pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&this->data_,2);
  *pfVar1 = m20;
  pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&this->data_,3);
  *pfVar1 = m30;
  pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&this->data_,4);
  *pfVar1 = m01;
  pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&this->data_,5);
  *pfVar1 = m11;
  pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&this->data_,6);
  *pfVar1 = m21;
  pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&this->data_,7);
  *pfVar1 = m31;
  pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&this->data_,8);
  *pfVar1 = m02;
  pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&this->data_,9);
  *pfVar1 = m12;
  pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&this->data_,10);
  *pfVar1 = m22;
  pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&this->data_,0xb);
  *pfVar1 = m32;
  pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&this->data_,0xc);
  *pfVar1 = m03;
  pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&this->data_,0xd);
  *pfVar1 = m13;
  pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&this->data_,0xe);
  *pfVar1 = m23;
  pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[](&this->data_,0xf);
  *pfVar1 = m33;
  return;
}

Assistant:

SquareMatrix( const T m00 , const T m01 , const T m02 , const T m03 ,
                      const T m10 , const T m11 , const T m12 , const T m13 ,
                      const T m20 , const T m21 , const T m22 , const T m23 ,
                      const T m30 , const T m31 , const T m32 , const T m33 )
        : size_( 4 )
        , data_( alloc_unique_array< T >( 16 ) )
        {
          data_[ 0] = m00 ; data_[ 1] = m10 ; data_[ 2] = m20 ; data_[ 3] = m30;
          data_[ 4] = m01 ; data_[ 5] = m11 ; data_[ 6] = m21 ; data_[ 7] = m31;
          data_[ 8] = m02 ; data_[ 9] = m12 ; data_[10] = m22 ; data_[11] = m32;
          data_[12] = m03 ; data_[13] = m13 ; data_[14] = m23 ; data_[15] = m33;
        }